

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O0

void Fxch_ManUpdate(Fxch_Man_t *pFxchMan,int iDiv)

{
  Vec_Wec_t *pVVar1;
  Vec_Wec_t *pVVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  int *piVar10;
  bool bVar11;
  int *pOutputID1;
  int *pOutputID0;
  int RetValue;
  int j;
  Vec_Int_t *vDivCubePairs;
  Vec_Int_t *vCube1;
  Vec_Int_t *vCube0;
  int local_28;
  int iVarNew;
  int Lit1;
  int Lit0;
  int iCube1;
  int iCube0;
  int i;
  int iDiv_local;
  Fxch_Man_t *pFxchMan_local;
  
  iVarNew = -1;
  local_28 = -1;
  Vec_IntClear(pFxchMan->vDiv);
  pVVar8 = pFxchMan->vDiv;
  pVVar7 = Hsh_VecReadEntry(pFxchMan->pDivHash,iDiv);
  Vec_IntAppend(pVVar8,pVVar7);
  Vec_IntClear(pFxchMan->vCubesS);
  iVar3 = Vec_IntSize(pFxchMan->vDiv);
  if (iVar3 == 2) {
    iVar3 = Vec_IntEntry(pFxchMan->vDiv,0);
    iVarNew = Abc_Lit2Var(iVar3);
    iVar3 = Vec_IntEntry(pFxchMan->vDiv,1);
    local_28 = Abc_Lit2Var(iVar3);
    if ((iVarNew < 0) || (local_28 < 0)) {
      __assert_fail("Lit0 >= 0 && Lit1 >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxch/FxchMan.c"
                    ,0x25e,"void Fxch_ManUpdate(Fxch_Man_t *, int)");
    }
    pVVar1 = pFxchMan->vCubes;
    pVVar2 = pFxchMan->vLits;
    iVar3 = Abc_LitNot(iVarNew);
    pVVar8 = Vec_WecEntry(pVVar2,iVar3);
    Fxch_ManCompressCubes(pVVar1,pVVar8);
    pVVar1 = pFxchMan->vCubes;
    pVVar2 = pFxchMan->vLits;
    iVar3 = Abc_LitNot(local_28);
    pVVar8 = Vec_WecEntry(pVVar2,iVar3);
    Fxch_ManCompressCubes(pVVar1,pVVar8);
    pVVar1 = pFxchMan->vLits;
    iVar3 = Abc_LitNot(iVarNew);
    pVVar8 = Vec_WecEntry(pVVar1,iVar3);
    pVVar1 = pFxchMan->vLits;
    iVar3 = Abc_LitNot(local_28);
    pVVar7 = Vec_WecEntry(pVVar1,iVar3);
    Vec_IntTwoRemoveCommon(pVVar8,pVVar7,pFxchMan->vCubesS);
  }
  Vec_IntClear(pFxchMan->vPairs);
  pVVar8 = Vec_WecEntry(pFxchMan->vDivCubePairs,iDiv);
  Vec_IntAppend(pFxchMan->vPairs,pVVar8);
  Vec_IntErase(pVVar8);
  for (iCube1 = 0; iVar3 = Vec_IntSize(pFxchMan->vPairs), iCube1 + 1 < iVar3; iCube1 = iCube1 + 2) {
    iVar3 = Vec_IntEntry(pFxchMan->vPairs,iCube1);
    iVar5 = Vec_IntEntry(pFxchMan->vPairs,iCube1 + 1);
    iVar6 = Fxch_ManGetLit(pFxchMan,iVar3,0);
    iVar4 = Fxch_ManGetLit(pFxchMan,iVar5,0);
    if (iVar6 != iVar4) {
      __assert_fail("Fxch_ManGetLit( pFxchMan, iCube0, 0) == Fxch_ManGetLit( pFxchMan, iCube1, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxch/FxchMan.c"
                    ,0x26f,"void Fxch_ManUpdate(Fxch_Man_t *, int)");
    }
    if (iVar5 < iVar3) {
      Vec_IntSetEntry(pFxchMan->vPairs,iCube1,iVar5);
      Vec_IntSetEntry(pFxchMan->vPairs,iCube1 + 1,iVar3);
    }
  }
  Vec_IntUniqifyPairs(pFxchMan->vPairs);
  iVar3 = Vec_IntSize(pFxchMan->vPairs);
  if (iVar3 % 2 == 0) {
    for (iCube1 = 0; iVar3 = Vec_IntSize(pFxchMan->vCubesS), iCube1 < iVar3; iCube1 = iCube1 + 1) {
      iVar3 = Vec_IntEntry(pFxchMan->vCubesS,iCube1);
      Fxch_ManDivSingleCube(pFxchMan,iVar3,0,1);
      iVar5 = Vec_WecEntryEntry(pFxchMan->vCubes,iVar3,0);
      if (iVar5 == 0) {
        Fxch_ManDivDoubleCube(pFxchMan,iVar3,0,1);
      }
    }
    for (iCube1 = 0; iVar3 = Vec_IntSize(pFxchMan->vPairs), iCube1 < iVar3; iCube1 = iCube1 + 1) {
      iVar3 = Vec_IntEntry(pFxchMan->vPairs,iCube1);
      Fxch_ManDivSingleCube(pFxchMan,iVar3,0,1);
      iVar5 = Vec_WecEntryEntry(pFxchMan->vCubes,iVar3,0);
      if (iVar5 == 0) {
        Fxch_ManDivDoubleCube(pFxchMan,iVar3,0,1);
      }
    }
    Vec_IntClear(pFxchMan->vCubesToUpdate);
    iVar3 = Fxch_DivIsNotConstant1(pFxchMan->vDiv);
    if (iVar3 == 0) {
      Fxch_ManExtractDivFromCubePairs(pFxchMan,0);
    }
    else {
      iVar3 = Fxch_ManCreateCube(pFxchMan,iVarNew,local_28);
      Fxch_ManExtractDivFromCube(pFxchMan,iVarNew,local_28,iVar3);
      Fxch_ManExtractDivFromCubePairs(pFxchMan,iVar3);
    }
    iVar3 = Vec_IntSize(pFxchMan->vCubesToUpdate);
    if (iVar3 == 0) {
      __assert_fail("Vec_IntSize( pFxchMan->vCubesToUpdate )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxch/FxchMan.c"
                    ,0x295,"void Fxch_ManUpdate(Fxch_Man_t *, int)");
    }
    for (iCube1 = 0; iVar3 = Vec_IntSize(pFxchMan->vCubesToUpdate), iCube1 < iVar3;
        iCube1 = iCube1 + 1) {
      iVar3 = Vec_IntEntry(pFxchMan->vCubesToUpdate,iCube1);
      Fxch_ManDivSingleCube(pFxchMan,iVar3,1,1);
      iVar5 = Vec_WecEntryEntry(pFxchMan->vCubes,iVar3,0);
      if (iVar5 == 0) {
        Fxch_ManDivDoubleCube(pFxchMan,iVar3,1,1);
      }
    }
    iVar3 = Vec_IntSize(pFxchMan->vSCC);
    if (iVar3 != 0) {
      Vec_IntUniqifyPairs(pFxchMan->vSCC);
      iVar3 = Vec_IntSize(pFxchMan->vSCC);
      if (iVar3 % 2 != 0) {
        __assert_fail("Vec_IntSize( pFxchMan->vSCC ) % 2 == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxch/FxchMan.c"
                      ,0x2a4,"void Fxch_ManUpdate(Fxch_Man_t *, int)");
      }
      for (iCube1 = 0; iVar3 = Vec_IntSize(pFxchMan->vSCC), iCube1 + 1 < iVar3; iCube1 = iCube1 + 2)
      {
        iVar3 = Vec_IntEntry(pFxchMan->vSCC,iCube1);
        iVar5 = Vec_IntEntry(pFxchMan->vSCC,iCube1 + 1);
        bVar11 = true;
        piVar9 = Vec_IntEntryP(pFxchMan->vOutputID,iVar3 * pFxchMan->nSizeOutputID);
        piVar10 = Vec_IntEntryP(pFxchMan->vOutputID,iVar5 * pFxchMan->nSizeOutputID);
        pVVar8 = Vec_WecEntry(pFxchMan->vCubes,iVar3);
        pVVar7 = Vec_WecEntry(pFxchMan->vCubes,iVar5);
        iVar6 = Vec_WecIntHasMark(pVVar8);
        if (iVar6 == 0) {
          Fxch_ManDivSingleCube(pFxchMan,iVar3,0,1);
          Fxch_ManDivDoubleCube(pFxchMan,iVar3,0,1);
          Vec_WecIntSetMark(pVVar8);
        }
        iVar6 = Vec_WecIntHasMark(pVVar7);
        if (iVar6 == 0) {
          Fxch_ManDivSingleCube(pFxchMan,iVar5,0,1);
          Fxch_ManDivDoubleCube(pFxchMan,iVar5,0,1);
          Vec_WecIntSetMark(pVVar7);
        }
        iVar5 = Vec_IntSize(pVVar8);
        iVar6 = Vec_IntSize(pVVar7);
        if (iVar5 == iVar6) {
          for (pOutputID0._4_4_ = 0; pOutputID0._4_4_ < pFxchMan->nSizeOutputID;
              pOutputID0._4_4_ = pOutputID0._4_4_ + 1) {
            piVar10[pOutputID0._4_4_] = piVar9[pOutputID0._4_4_] | piVar10[pOutputID0._4_4_];
            piVar9[pOutputID0._4_4_] = 0;
          }
          pVVar7 = Vec_WecEntry(pFxchMan->vCubes,iVar3);
          Vec_IntClear(pVVar7);
          Vec_WecIntXorMark(pVVar8);
        }
        else {
          for (pOutputID0._4_4_ = 0; pOutputID0._4_4_ < pFxchMan->nSizeOutputID && bVar11;
              pOutputID0._4_4_ = pOutputID0._4_4_ + 1) {
            bVar11 = piVar9[pOutputID0._4_4_] == piVar10[pOutputID0._4_4_];
          }
          if (bVar11) {
            pVVar7 = Vec_WecEntry(pFxchMan->vCubes,iVar3);
            Vec_IntClear(pVVar7);
            Vec_WecIntXorMark(pVVar8);
          }
          else {
            pOutputID0._0_4_ = 0;
            for (pOutputID0._4_4_ = 0; pOutputID0._4_4_ < pFxchMan->nSizeOutputID;
                pOutputID0._4_4_ = pOutputID0._4_4_ + 1) {
              pOutputID0._0_4_ =
                   piVar9[pOutputID0._4_4_] & (piVar10[pOutputID0._4_4_] ^ 0xffffffffU) |
                   (uint)pOutputID0;
              piVar9[pOutputID0._4_4_] =
                   (piVar10[pOutputID0._4_4_] ^ 0xffffffffU) & piVar9[pOutputID0._4_4_];
            }
            if ((uint)pOutputID0 == 0) {
              pVVar7 = Vec_WecEntry(pFxchMan->vCubes,iVar3);
              Vec_IntClear(pVVar7);
              Vec_WecIntXorMark(pVVar8);
            }
          }
        }
      }
      for (iCube1 = 0; iVar3 = Vec_IntSize(pFxchMan->vSCC), iCube1 + 1 < iVar3; iCube1 = iCube1 + 2)
      {
        iVar3 = Vec_IntEntry(pFxchMan->vSCC,iCube1);
        iVar5 = Vec_IntEntry(pFxchMan->vSCC,iCube1 + 1);
        pVVar8 = Vec_WecEntry(pFxchMan->vCubes,iVar3);
        pVVar7 = Vec_WecEntry(pFxchMan->vCubes,iVar5);
        iVar6 = Vec_WecIntHasMark(pVVar8);
        if (iVar6 != 0) {
          Fxch_ManDivSingleCube(pFxchMan,iVar3,1,1);
          Fxch_ManDivDoubleCube(pFxchMan,iVar3,1,1);
          Vec_WecIntXorMark(pVVar8);
        }
        iVar3 = Vec_WecIntHasMark(pVVar7);
        if (iVar3 != 0) {
          Fxch_ManDivSingleCube(pFxchMan,iVar5,1,1);
          Fxch_ManDivDoubleCube(pFxchMan,iVar5,1,1);
          Vec_WecIntXorMark(pVVar7);
        }
      }
      Vec_IntClear(pFxchMan->vSCC);
    }
    pFxchMan->nExtDivs = pFxchMan->nExtDivs + 1;
    return;
  }
  __assert_fail("Vec_IntSize( pFxchMan->vPairs ) % 2 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxch/FxchMan.c"
                ,0x278,"void Fxch_ManUpdate(Fxch_Man_t *, int)");
}

Assistant:

void Fxch_ManUpdate( Fxch_Man_t* pFxchMan,
                     int iDiv )
{
    int i, iCube0, iCube1,
        Lit0 = -1,
        Lit1 = -1,
        iVarNew;

    Vec_Int_t* vCube0,
             * vCube1,
             * vDivCubePairs;

    /* Get the selected candidate (divisor) */
    Vec_IntClear( pFxchMan->vDiv );
    Vec_IntAppend( pFxchMan->vDiv, Hsh_VecReadEntry( pFxchMan->pDivHash, iDiv ) );

    /* Find cubes associated with the divisor */
    Vec_IntClear( pFxchMan->vCubesS );
    if ( Vec_IntSize( pFxchMan->vDiv ) == 2 )
    {
        Lit0 = Abc_Lit2Var( Vec_IntEntry( pFxchMan->vDiv, 0 ) );
        Lit1 = Abc_Lit2Var( Vec_IntEntry( pFxchMan->vDiv, 1 ) );
        assert( Lit0 >= 0 && Lit1 >= 0 );

        Fxch_ManCompressCubes( pFxchMan->vCubes, Vec_WecEntry( pFxchMan->vLits, Abc_LitNot( Lit0 ) ) );
        Fxch_ManCompressCubes( pFxchMan->vCubes, Vec_WecEntry( pFxchMan->vLits, Abc_LitNot( Lit1 ) ) );
        Vec_IntTwoRemoveCommon( Vec_WecEntry( pFxchMan->vLits, Abc_LitNot( Lit0 ) ),
                                Vec_WecEntry( pFxchMan->vLits, Abc_LitNot( Lit1 ) ),
                                pFxchMan->vCubesS );
    }

    /* Find pairs associated with the divisor */
    Vec_IntClear( pFxchMan->vPairs );
    vDivCubePairs = Vec_WecEntry( pFxchMan->vDivCubePairs, iDiv );
    Vec_IntAppend( pFxchMan->vPairs, vDivCubePairs );
    Vec_IntErase( vDivCubePairs );

    Vec_IntForEachEntryDouble( pFxchMan->vPairs, iCube0, iCube1, i )
    {
        assert( Fxch_ManGetLit( pFxchMan, iCube0, 0) == Fxch_ManGetLit( pFxchMan, iCube1, 0) );
        if (iCube0 > iCube1)
        {
            Vec_IntSetEntry( pFxchMan->vPairs, i, iCube1);
            Vec_IntSetEntry( pFxchMan->vPairs, i+1, iCube0);
        }
    }

    Vec_IntUniqifyPairs( pFxchMan->vPairs );
    assert( Vec_IntSize( pFxchMan->vPairs ) % 2 == 0 );

    /* subtract cost of single-cube divisors */
    Vec_IntForEachEntry( pFxchMan->vCubesS, iCube0, i )
    {
        Fxch_ManDivSingleCube( pFxchMan, iCube0, 0, 1);

        if ( Vec_WecEntryEntry( pFxchMan->vCubes, iCube0, 0 ) == 0 )
            Fxch_ManDivDoubleCube( pFxchMan, iCube0, 0, 1 );
    }

    Vec_IntForEachEntry( pFxchMan->vPairs, iCube0, i )
    {
        Fxch_ManDivSingleCube( pFxchMan, iCube0, 0, 1);

        if ( Vec_WecEntryEntry( pFxchMan->vCubes, iCube0, 0 ) == 0 )
            Fxch_ManDivDoubleCube( pFxchMan, iCube0, 0, 1 );
    }

    Vec_IntClear( pFxchMan->vCubesToUpdate );
    if ( Fxch_DivIsNotConstant1( pFxchMan->vDiv ) )
    {
        iVarNew = Fxch_ManCreateCube( pFxchMan, Lit0, Lit1 );
        Fxch_ManExtractDivFromCube( pFxchMan, Lit0, Lit1, iVarNew );
        Fxch_ManExtractDivFromCubePairs( pFxchMan, iVarNew );
    }
    else
        Fxch_ManExtractDivFromCubePairs( pFxchMan, 0 );

    assert( Vec_IntSize( pFxchMan->vCubesToUpdate ) );

    /* Add cost */
    Vec_IntForEachEntry( pFxchMan->vCubesToUpdate, iCube0, i )
    {
        Fxch_ManDivSingleCube( pFxchMan, iCube0, 1, 1 );

        if ( Vec_WecEntryEntry( pFxchMan->vCubes, iCube0, 0 ) == 0 )
            Fxch_ManDivDoubleCube( pFxchMan, iCube0, 1, 1 );
    }

    /* Deal with SCC */
    if ( Vec_IntSize( pFxchMan->vSCC ) )
    {
        Vec_IntUniqifyPairs( pFxchMan->vSCC );
        assert( Vec_IntSize( pFxchMan->vSCC ) % 2 == 0 );

        Vec_IntForEachEntryDouble( pFxchMan->vSCC, iCube0, iCube1, i )
        {
            int j, RetValue = 1;
            int* pOutputID0 = Vec_IntEntryP( pFxchMan->vOutputID, iCube0 * pFxchMan->nSizeOutputID );
            int* pOutputID1 = Vec_IntEntryP( pFxchMan->vOutputID, iCube1 * pFxchMan->nSizeOutputID );
            vCube0 = Vec_WecEntry( pFxchMan->vCubes, iCube0 );
            vCube1 = Vec_WecEntry( pFxchMan->vCubes, iCube1 );

            if ( !Vec_WecIntHasMark( vCube0 ) )
            {
                Fxch_ManDivSingleCube( pFxchMan, iCube0, 0, 1 );
                Fxch_ManDivDoubleCube( pFxchMan, iCube0, 0, 1 );
                Vec_WecIntSetMark( vCube0 );
            }

            if ( !Vec_WecIntHasMark( vCube1 ) )
            {
                Fxch_ManDivSingleCube( pFxchMan, iCube1, 0, 1 );
                Fxch_ManDivDoubleCube( pFxchMan, iCube1, 0, 1 );
                Vec_WecIntSetMark( vCube1 );
            }

            if ( Vec_IntSize( vCube0 ) == Vec_IntSize( vCube1 ) )
            {
                for ( j = 0; j < pFxchMan->nSizeOutputID; j++ )
                {
                    pOutputID1[j] |= pOutputID0[j];
                    pOutputID0[j] = 0;
                }
                Vec_IntClear( Vec_WecEntry( pFxchMan->vCubes, iCube0 ) );
                Vec_WecIntXorMark( vCube0 );
                continue;
            }

            for ( j = 0; j < pFxchMan->nSizeOutputID && RetValue; j++ )
                RetValue = ( pOutputID0[j] == pOutputID1[j] );

            if ( RetValue )
            {
                Vec_IntClear( Vec_WecEntry( pFxchMan->vCubes, iCube0 ) );
                Vec_WecIntXorMark( vCube0 );
            }
            else
            {
                RetValue = 0;
                for ( j = 0; j < pFxchMan->nSizeOutputID; j++ )
                {
                    RetValue |= ( pOutputID0[j] & ~( pOutputID1[j] ) );
                    pOutputID0[j] &= ~( pOutputID1[j] );
                }

                if ( RetValue == 0 )
                {
                    Vec_IntClear( Vec_WecEntry( pFxchMan->vCubes, iCube0 ) );
                    Vec_WecIntXorMark( vCube0 );
                }
            }
        }

        Vec_IntForEachEntryDouble( pFxchMan->vSCC, iCube0, iCube1, i )
        {
            vCube0 = Vec_WecEntry( pFxchMan->vCubes, iCube0 );
            vCube1 = Vec_WecEntry( pFxchMan->vCubes, iCube1 );

            if ( Vec_WecIntHasMark( vCube0 ) )
            {
                Fxch_ManDivSingleCube( pFxchMan, iCube0, 1, 1 );
                Fxch_ManDivDoubleCube( pFxchMan, iCube0, 1, 1 );
                Vec_WecIntXorMark( vCube0 );
            }

            if ( Vec_WecIntHasMark( vCube1 ) )
            {
                Fxch_ManDivSingleCube( pFxchMan, iCube1, 1, 1 );
                Fxch_ManDivDoubleCube( pFxchMan, iCube1, 1, 1 );
                Vec_WecIntXorMark( vCube1 );
            }
        }

        Vec_IntClear( pFxchMan->vSCC );
    }

    pFxchMan->nExtDivs++;
}